

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafmode.c
# Opt level: O1

parser_error parse_graf_size(parser *p)

{
  uint uVar1;
  parser_error pVar2;
  void *pvVar3;
  char *src;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    uVar1 = parser_getuint(p,"wid");
    *(short *)((long)pvVar3 + 0xc) = (short)uVar1;
    uVar1 = parser_getuint(p,"hgt");
    *(short *)((long)pvVar3 + 0xe) = (short)uVar1;
    src = parser_getstr(p,"filename");
    my_strcpy((char *)((long)pvVar3 + 0x130),src,0x20);
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_graf_size(struct parser *p) {
	graphics_mode *mode = parser_priv(p);
	if (!mode) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	mode->cell_width = parser_getuint(p, "wid");
	mode->cell_height = parser_getuint(p, "hgt");
	my_strcpy(mode->file, parser_getstr(p, "filename"), 32);
	return PARSE_ERROR_NONE;
}